

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_info.h
# Opt level: O0

void __thiscall
KokkosTools::KernelTimer::KernelPerformanceInfo::writeToBinaryFile
          (KernelPerformanceInfo *this,FILE *output)

{
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *src;
  KernelExecutionType local_34;
  void *pvStack_30;
  uint32_t kernelTypeOutput;
  char *entry;
  uint local_20;
  uint32_t nextIndex;
  uint32_t recordLen;
  uint32_t kernelNameLen;
  FILE *output_local;
  KernelPerformanceInfo *this_local;
  
  _recordLen = (FILE *)output;
  output_local = (FILE *)this;
  nextIndex = std::__cxx11::string::size();
  local_20 = nextIndex + 0x20;
  entry._4_4_ = 0;
  pvStack_30 = malloc((ulong)local_20);
  copy(this,(EVP_PKEY_CTX *)((long)pvStack_30 + (ulong)entry._4_4_),(EVP_PKEY_CTX *)&nextIndex);
  entry._4_4_ = entry._4_4_ + 4;
  dst = (EVP_PKEY_CTX *)((long)pvStack_30 + (ulong)entry._4_4_);
  src = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
  copy(this,dst,src);
  entry._4_4_ = nextIndex + entry._4_4_;
  copy(this,(EVP_PKEY_CTX *)((long)pvStack_30 + (ulong)entry._4_4_),(EVP_PKEY_CTX *)&this->callCount
      );
  entry._4_4_ = entry._4_4_ + 8;
  copy(this,(EVP_PKEY_CTX *)((long)pvStack_30 + (ulong)entry._4_4_),(EVP_PKEY_CTX *)&this->time);
  entry._4_4_ = entry._4_4_ + 8;
  copy(this,(EVP_PKEY_CTX *)((long)pvStack_30 + (ulong)entry._4_4_),(EVP_PKEY_CTX *)&this->timeSq);
  entry._4_4_ = entry._4_4_ + 8;
  local_34 = this->kType;
  copy(this,(EVP_PKEY_CTX *)((long)pvStack_30 + (ulong)entry._4_4_),(EVP_PKEY_CTX *)&local_34);
  entry._4_4_ = entry._4_4_ + 4;
  fwrite(&local_20,4,1,_recordLen);
  fwrite(pvStack_30,(ulong)local_20,1,_recordLen);
  free(pvStack_30);
  return;
}

Assistant:

void writeToBinaryFile(FILE* output) {
    const uint32_t kernelNameLen = kernelName.size();
    const uint32_t recordLen = sizeof(uint32_t) + sizeof(char) * kernelNameLen +
                               sizeof(uint64_t) + sizeof(double) +
                               sizeof(double) + sizeof(uint32_t);

    uint32_t nextIndex = 0;
    char* entry        = (char*)malloc(recordLen);

    copy(&entry[nextIndex], (char*)&kernelNameLen, sizeof(kernelNameLen));
    nextIndex += sizeof(kernelNameLen);

    copy(&entry[nextIndex], kernelName.c_str(), kernelNameLen);
    nextIndex += kernelNameLen;

    copy(&entry[nextIndex], (char*)&callCount, sizeof(callCount));
    nextIndex += sizeof(callCount);

    copy(&entry[nextIndex], (char*)&time, sizeof(time));
    nextIndex += sizeof(time);

    copy(&entry[nextIndex], (char*)&timeSq, sizeof(timeSq));
    nextIndex += sizeof(timeSq);

    uint32_t kernelTypeOutput = (uint32_t)kType;
    copy(&entry[nextIndex], (char*)&kernelTypeOutput, sizeof(kernelTypeOutput));
    nextIndex += sizeof(kernelTypeOutput);

    fwrite(&recordLen, sizeof(uint32_t), 1, output);
    fwrite(entry, recordLen, 1, output);
    free(entry);
  }